

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t * ae_wcstofflags(wchar_t *s,unsigned_long *setp,unsigned_long *clrp)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  bool bVar3;
  size_t flag_length;
  size_t length;
  wchar_t *failed;
  unsigned_long clear;
  unsigned_long set;
  flag *flag;
  wchar_t *end;
  wchar_t *start;
  unsigned_long *clrp_local;
  unsigned_long *setp_local;
  wchar_t *s_local;
  
  failed = (wchar_t *)0x0;
  clear = 0;
  length = 0;
  end = s;
  while( true ) {
    bVar3 = true;
    if ((*end != L'\t') && (bVar3 = true, *end != L' ')) {
      bVar3 = *end == L',';
    }
    if (!bVar3) break;
    end = end + 1;
  }
  do {
    if (*end == L'\0') {
      if (setp != (unsigned_long *)0x0) {
        *setp = clear;
      }
      if (clrp != (unsigned_long *)0x0) {
        *clrp = (unsigned_long)failed;
      }
      return (wchar_t *)length;
    }
    flag = (flag *)end;
    while( true ) {
      bVar3 = false;
      if (((*(int *)&flag->name != 0) && (bVar3 = false, *(int *)&flag->name != 9)) &&
         (bVar3 = false, *(int *)&flag->name != 0x20)) {
        bVar3 = *(int *)&flag->name != 0x2c;
      }
      if (!bVar3) break;
      flag = (flag *)((long)&flag->name + 4);
    }
    __n = (long)flag - (long)end >> 2;
    for (set = (unsigned_long)flags; *(long *)(set + 8) != 0; set = set + 0x20) {
      sVar2 = wcslen(*(wchar_t **)(set + 8));
      if ((__n == sVar2) && (iVar1 = wmemcmp(end,*(wchar_t **)(set + 8),__n), iVar1 == 0)) {
        failed = (wchar_t *)(*(ulong *)(set + 0x10) | (ulong)failed);
        clear = *(ulong *)(set + 0x18) | clear;
        break;
      }
      if ((__n == sVar2 - 2) &&
         (iVar1 = wmemcmp(end,(wchar_t *)(*(long *)(set + 8) + 8),__n), iVar1 == 0)) {
        clear = *(ulong *)(set + 0x10) | clear;
        failed = (wchar_t *)(*(ulong *)(set + 0x18) | (ulong)failed);
        break;
      }
    }
    if ((*(long *)(set + 8) == 0) && (length == 0)) {
      length = (size_t)end;
    }
    end = (wchar_t *)flag;
    while( true ) {
      bVar3 = true;
      if ((*end != L'\t') && (bVar3 = true, *end != L' ')) {
        bVar3 = *end == L',';
      }
      if (!bVar3) break;
      end = end + 1;
    }
  } while( true );
}

Assistant:

static const wchar_t *
ae_wcstofflags(const wchar_t *s, unsigned long *setp, unsigned long *clrp)
{
	const wchar_t *start, *end;
	const struct flag *flag;
	unsigned long set, clear;
	const wchar_t *failed;

	set = clear = 0;
	start = s;
	failed = NULL;
	/* Find start of first token. */
	while (*start == L'\t'  ||  *start == L' '  ||  *start == L',')
		start++;
	while (*start != L'\0') {
		size_t length;
		/* Locate end of token. */
		end = start;
		while (*end != L'\0'  &&  *end != L'\t'  &&
		    *end != L' '  &&  *end != L',')
			end++;
		length = end - start;
		for (flag = flags; flag->wname != NULL; flag++) {
			size_t flag_length = wcslen(flag->wname);
			if (length == flag_length
			    && wmemcmp(start, flag->wname, length) == 0) {
				/* Matched "noXXXX", so reverse the sense. */
				clear |= flag->set;
				set |= flag->clear;
				break;
			} else if (length == flag_length - 2
			    && wmemcmp(start, flag->wname + 2, length) == 0) {
				/* Matched "XXXX", so don't reverse. */
				set |= flag->set;
				clear |= flag->clear;
				break;
			}
		}
		/* Ignore unknown flag names. */
		if (flag->wname == NULL  &&  failed == NULL)
			failed = start;

		/* Find start of next token. */
		start = end;
		while (*start == L'\t'  ||  *start == L' '  ||  *start == L',')
			start++;

	}

	if (setp)
		*setp = set;
	if (clrp)
		*clrp = clear;

	/* Return location of first failure. */
	return (failed);
}